

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O2

void __thiscall cmSourceFileLocation::UpdateExtension(cmSourceFileLocation *this,string *name)

{
  bool bVar1;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  string tryPath;
  string ext;
  string local_48;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0x59,"void cmSourceFileLocation::UpdateExtension(const std::string &)");
  }
  cmsys::SystemTools::GetFilenameLastExtension(&ext,name);
  if (ext._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&tryPath,(ulong)&ext);
    std::__cxx11::string::operator=((string *)&ext,(string *)&tryPath);
    std::__cxx11::string::~string((string *)&tryPath);
  }
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmGlobalGenerator::GetLanguageFromExtension_abi_cxx11_(&tryPath,this_00,ext._M_dataplus._M_p);
  if (tryPath._M_string_length == 0) {
    bVar1 = cmake::IsSourceExtension(this_01,&ext);
    if (bVar1) goto LAB_001b6c8a;
    bVar1 = cmake::IsHeaderExtension(this_01,&ext);
    std::__cxx11::string::~string((string *)&tryPath);
    if (!bVar1) {
      tryPath._M_dataplus._M_p = (pointer)&tryPath.field_2;
      tryPath._M_string_length = 0;
      tryPath.field_2._M_local_buf[0] = '\0';
      if (this->AmbiguousDirectory == true) {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
        std::__cxx11::string::_M_assign((string *)&tryPath);
        std::__cxx11::string::append((char *)&tryPath);
      }
      if ((this->Directory)._M_string_length != 0) {
        std::__cxx11::string::append((string *)&tryPath);
        std::__cxx11::string::append((char *)&tryPath);
      }
      std::__cxx11::string::append((string *)&tryPath);
      bVar1 = cmsys::SystemTools::FileExists(&tryPath,true);
      if (bVar1) {
        cmsys::SystemTools::GetFilenameName(&local_48,name);
        std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        this->AmbiguousExtension = false;
        if (this->AmbiguousDirectory == true) {
          DirectoryUseSource(this);
        }
      }
      std::__cxx11::string::~string((string *)&tryPath);
      goto LAB_001b6cb8;
    }
  }
  else {
LAB_001b6c8a:
    std::__cxx11::string::~string((string *)&tryPath);
  }
  cmsys::SystemTools::GetFilenameName(&tryPath,name);
  std::__cxx11::string::operator=((string *)&this->Name,(string *)&tryPath);
  std::__cxx11::string::~string((string *)&tryPath);
  this->AmbiguousExtension = false;
LAB_001b6cb8:
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

void cmSourceFileLocation::UpdateExtension(const std::string& name)
{
  assert(this->Makefile);
  // Check the extension.
  std::string ext = cmSystemTools::GetFilenameLastExtension(name);
  if (!ext.empty()) {
    ext = ext.substr(1);
  }

  // The global generator checks extensions of enabled languages.
  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  cmMakefile const* mf = this->Makefile;
  auto cm = mf->GetCMakeInstance();
  if (!gg->GetLanguageFromExtension(ext.c_str()).empty() ||
      cm->IsSourceExtension(ext) || cm->IsHeaderExtension(ext)) {
    // This is a known extension.  Use the given filename with extension.
    this->Name = cmSystemTools::GetFilenameName(name);
    this->AmbiguousExtension = false;
  } else {
    // This is not a known extension.  See if the file exists on disk as
    // named.
    std::string tryPath;
    if (this->AmbiguousDirectory) {
      // Check the source tree only because a file in the build tree should
      // be specified by full path at least once.  We do not want this
      // detection to depend on whether the project has already been built.
      tryPath = this->Makefile->GetCurrentSourceDirectory();
      tryPath += "/";
    }
    if (!this->Directory.empty()) {
      tryPath += this->Directory;
      tryPath += "/";
    }
    tryPath += this->Name;
    if (cmSystemTools::FileExists(tryPath, true)) {
      // We found a source file named by the user on disk.  Trust it's
      // extension.
      this->Name = cmSystemTools::GetFilenameName(name);
      this->AmbiguousExtension = false;

      // If the directory was ambiguous, it isn't anymore.
      if (this->AmbiguousDirectory) {
        this->DirectoryUseSource();
      }
    }
  }
}